

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O2

void cppqc::detail::TupleGeneratorHelper_shrink<0,int>::
     appendShrinks<std::tuple<cppqc::Generator<int>>>
               (tuple<int> *shrinkInput,
               vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_> *shrinkOutput,
               tuple<cppqc::Generator<int>_> *generators)

{
  __uniq_ptr_impl<cppqc::detail::GenConcept<int>,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
  _Var1;
  int *localShrink;
  pointer piVar2;
  vector<int,_std::allocator<int>_> allLocalShrinks;
  _Head_base<0UL,_int,_false> local_3c;
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  _Var1._M_t.
  super__Tuple_impl<0UL,_cppqc::detail::GenConcept<int>_*,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
  .super__Head_base<0UL,_cppqc::detail::GenConcept<int>_*,_false>._M_head_impl =
       (generators->super__Tuple_impl<0UL,_cppqc::Generator<int>_>).
       super__Head_base<0UL,_cppqc::Generator<int>,_false>._M_head_impl.m_gen._M_t.
       super___uniq_ptr_impl<cppqc::detail::GenConcept<int>,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
       ._M_t;
  (**(code **)(*(long *)_Var1._M_t.
                        super__Tuple_impl<0UL,_cppqc::detail::GenConcept<int>_*,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
                        .super__Head_base<0UL,_cppqc::detail::GenConcept<int>_*,_false>._M_head_impl
              + 0x18))
            (&local_38,
             _Var1._M_t.
             super__Tuple_impl<0UL,_cppqc::detail::GenConcept<int>_*,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
             .super__Head_base<0UL,_cppqc::detail::GenConcept<int>_*,_false>._M_head_impl,
             shrinkInput);
  for (piVar2 = local_38._M_impl.super__Vector_impl_data._M_start;
      piVar2 != local_38._M_impl.super__Vector_impl_data._M_finish; piVar2 = piVar2 + 1) {
    local_3c._M_head_impl = *piVar2;
    std::vector<std::tuple<int>,std::allocator<std::tuple<int>>>::emplace_back<std::tuple<int>>
              ((vector<std::tuple<int>,std::allocator<std::tuple<int>>> *)shrinkOutput,
               (tuple<int> *)&local_3c);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

static void appendShrinks(const std::tuple<T...>& shrinkInput,
                            std::vector<std::tuple<T...>>& shrinkOutput,
                            const Generators& generators) {
    // Compute all shrink combinations for the tuple
    // element at the position "offset".
    // All other elements will not be changed.
    static_assert(offset >= 0 && offset < sizeof...(T), "offset out of bounds");
    auto allLocalShrinks =
        std::get<offset>(generators).shrink(std::get<offset>(shrinkInput));
    for (auto&& localShrink : allLocalShrinks) {
      auto copiedShrinkInput = shrinkInput;
      std::get<offset>(copiedShrinkInput) = std::move(localShrink);
      shrinkOutput.push_back(std::move(copiedShrinkInput));
    }

    // continue recursion (from right to left)
    TupleGeneratorHelper_shrink<offset - 1, T...>::appendShrinks(
        shrinkInput, shrinkOutput, generators);
  }